

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void anon_unknown.dwarf_c3f7::reshape(GLFWwindow *window,int width,int height)

{
  int in_EDX;
  int in_ESI;
  GLfloat zfar;
  GLfloat znear;
  GLfloat xmax;
  GLfloat h;
  
  (*glad_glViewport)(0,0,in_ESI,in_EDX);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glFrustum)(-0.5,0.5,(double)(((float)in_EDX / (float)in_ESI) * -0.5),
                    (double)(((float)in_EDX / (float)in_ESI) * 0.5),1.0,400.0);
  (*glad_glMatrixMode)(0x1700);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int width, int height )
    {
      GLfloat h = (GLfloat) height / (GLfloat) width;
      GLfloat xmax, znear, zfar;

      znear = 1.0f;
      zfar  = 400.0f;
      xmax  = znear * 0.5f;

      glViewport( 0, 0, (GLint) width, (GLint) height );
      glMatrixMode( GL_PROJECTION );
      glLoadIdentity();
      glFrustum( -xmax, xmax, -xmax*h, xmax*h, znear, zfar );
      glMatrixMode( GL_MODELVIEW );
    }